

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

int Acb_NtkEcoPerform(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG,char **pFileName,int fCisOnly,int fInputs,
                     int fCheck,int fVerbose,int fVeryVerbose)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  char **ppcVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  int *piVar11;
  Vec_Int_t *vDivs;
  Vec_Int_t *pVVar12;
  Vec_Int_t *vNodes;
  Gia_Man_t *pGVar13;
  Vec_Ptr_t *vSops;
  void **ppvVar14;
  Vec_Wec_t *vSupps;
  Vec_Ptr_t *vGias;
  Cnf_Dat_t *pCVar15;
  sat_solver *s;
  Vec_Int_t *pVVar16;
  Gia_Man_t *pGVar17;
  Vec_Ptr_t *vSops_00;
  Vec_Str_t *p;
  int iVar18;
  uint uVar19;
  int *piVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  int *piVar24;
  char *pcVar25;
  int iVar26;
  long lVar27;
  size_t __nmemb;
  long lVar28;
  bool bVar29;
  Gia_Man_t *local_100;
  uint local_e4;
  Vec_Int_t *vUsed;
  timespec ts;
  Vec_Str_t *local_b8;
  long local_b0;
  Vec_Bit_t *vBlock;
  int Lit;
  Vec_Int_t *local_90;
  Gia_Man_t *local_88;
  Gia_Man_t *local_80;
  Vec_Int_t *local_78;
  Vec_Int_t *local_70;
  Gia_Man_t *local_68;
  char **local_60;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  int *local_38;
  
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    local_b0 = -1;
  }
  else {
    local_b0 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  local_90 = &pNtkF->vTargets;
  uVar3 = (pNtkF->vTargets).nSize;
  uVar22 = (ulong)uVar3;
  piVar10 = (int *)0x0;
  local_38 = (int *)0x78;
  if (fCisOnly != 0) {
    local_38 = piVar10;
  }
  local_60 = pFileName;
  pVVar8 = Acb_NtkFindRoots(pNtkF,local_90,&vBlock);
  pVVar9 = Acb_NtkFindSupp(pNtkF,pVVar8);
  local_78 = pVVar8;
  local_70 = Acb_NtkFindSupp(pNtkG,pVVar8);
  iVar7 = pVVar9->nSize;
  iVar26 = local_70->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < (iVar26 + iVar7) - 1U) {
    iVar18 = iVar26 + iVar7;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar18;
  if (iVar18 != 0) {
    piVar10 = (int *)malloc((long)iVar18 << 2);
  }
  pVVar16 = local_78;
  pVVar8->pArray = piVar10;
  piVar24 = pVVar9->pArray;
  piVar20 = local_70->pArray;
  piVar1 = piVar24 + iVar7;
  piVar2 = piVar20 + iVar26;
  piVar11 = piVar10;
  if ((0 < iVar7) && (0 < iVar26)) {
    do {
      iVar7 = *piVar24;
      iVar26 = *piVar20;
      if (iVar7 == iVar26) {
        piVar24 = piVar24 + 1;
        *piVar11 = iVar7;
        piVar20 = piVar20 + 1;
      }
      else if (iVar7 < iVar26) {
        piVar24 = piVar24 + 1;
        *piVar11 = iVar7;
      }
      else {
        piVar20 = piVar20 + 1;
        *piVar11 = iVar26;
      }
      piVar11 = piVar11 + 1;
    } while ((piVar24 < piVar1) && (piVar20 < piVar2));
  }
  for (; piVar24 < piVar1; piVar24 = piVar24 + 1) {
    *piVar11 = *piVar24;
    piVar11 = piVar11 + 1;
  }
  for (; piVar20 < piVar2; piVar20 = piVar20 + 1) {
    *piVar11 = *piVar20;
    piVar11 = piVar11 + 1;
  }
  iVar7 = (int)((ulong)((long)piVar11 - (long)piVar10) >> 2);
  pVVar8->nSize = iVar7;
  if (pVVar8->nCap < iVar7) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x740,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar7 < pVVar9->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x741,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar7 < local_70->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x742,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (fInputs == 0 && fCisOnly == 0) {
    vDivs = Acb_NtkFindDivs(pNtkF,pVVar8,vBlock,fVerbose);
  }
  else {
    vDivs = Acb_NtkFindDivsCis(pNtkF,pVVar8);
  }
  pVVar12 = Acb_NtkFindNodes(pNtkF,pVVar16,vDivs);
  vNodes = Acb_NtkFindNodes(pNtkG,pVVar16,(Vec_Int_t *)0x0);
  local_58 = pVVar12;
  pGVar13 = Acb_NtkToGia(pNtkF,pVVar8,pVVar12,pVVar16,vDivs,local_90);
  local_50 = vNodes;
  local_48 = pVVar8;
  local_88 = Acb_NtkToGia(pNtkG,pVVar8,vNodes,pVVar16,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  local_80 = pGVar13;
  local_100 = Acb_CreateMiter(pGVar13,local_88);
  vSops = (Vec_Ptr_t *)malloc(0x10);
  ppvVar14 = (void **)0x0;
  uVar23 = 8;
  if (6 < uVar3 - 1) {
    uVar23 = uVar3;
  }
  vSops->nSize = 0;
  vSops->nCap = uVar23;
  __nmemb = (size_t)(int)uVar23;
  if (uVar23 != 0) {
    ppvVar14 = (void **)malloc(__nmemb * 8);
  }
  vSops->pArray = ppvVar14;
  vSupps = (Vec_Wec_t *)malloc(0x10);
  vSupps->nSize = 0;
  vSupps->nCap = uVar23;
  if (uVar23 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc(__nmemb,0x10);
  }
  vSupps->pArray = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar8->pArray = piVar10;
  vUsed = (Vec_Int_t *)0x0;
  if (fCisOnly == 0) {
    vGias = (Vec_Ptr_t *)0x0;
  }
  else {
    vGias = (Vec_Ptr_t *)malloc(0x10);
    vGias->nSize = 0;
    vGias->nCap = uVar23;
    if (uVar23 == 0) {
      ppvVar14 = (void **)0x0;
    }
    else {
      ppvVar14 = (void **)malloc(__nmemb << 3);
    }
    vGias->pArray = ppvVar14;
  }
  if (fVerbose != 0) {
    printf("The number of targets = %d.\n");
    printf("NtkF:  ");
    Gia_ManPrintStats(local_80,(Gps_Par_t *)0x0);
    printf("NtkG:  ");
    Gia_ManPrintStats(local_88,(Gps_Par_t *)0x0);
    printf("Miter: ");
    Gia_ManPrintStats(local_100,(Gps_Par_t *)0x0);
  }
  uVar21 = uVar22;
  pVVar16 = pVVar8;
  if (fCheck == 0) {
    local_e4 = 1;
  }
  else {
    pCVar15 = Acb_NtkDeriveMiterCnf(local_100,uVar3,uVar3,fVerbose);
    s = (sat_solver *)Cnf_DataWriteIntoSolver(pCVar15,1,0);
    Cnf_DataFree(pCVar15);
    Lit = 2;
    iVar7 = sat_solver_addclause(s,&Lit,(lit *)&local_90);
    if (iVar7 == 0) {
      bVar29 = true;
    }
    else {
      iVar7 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      bVar29 = iVar7 == -1;
    }
    sat_solver_delete(s);
    pcVar25 = "NO";
    if (bVar29 != false) {
      pcVar25 = "a";
    }
    printf("The ECO problem has %s solution. ",pcVar25);
    iVar26 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar28 = -1;
    }
    else {
      lVar28 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar26,"%s =","Time");
    Abc_Print(iVar26,"%9.2f sec\n",(double)(lVar28 - local_b0) / 1000000.0);
    local_e4 = (uint)bVar29;
    if (bVar29 == false) goto LAB_0039ebd5;
  }
  do {
    local_40 = pVVar16;
    if ((int)uVar21 < 1) {
      putchar(10);
      if (fCisOnly == 0) {
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar28 = 1;
        }
        else {
          lVar28 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar28 = ((lVar28 >> 7) - (lVar28 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        pCVar15 = (Cnf_Dat_t *)Mf_ManGenerateCnf(local_100,8,0,0,0,0);
        iVar7 = Acb_CheckMiter(pCVar15);
        Cnf_DataFree(pCVar15);
        pcVar25 = "The ECO solution was verified successfully.  ";
        if (iVar7 == 0) {
          pcVar25 = "The ECO solution verification FAILED.  ";
        }
        printf(pcVar25);
        iVar26 = 3;
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar27 = -1;
        }
        else {
          lVar27 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print(iVar26,"%s =","Time");
        Abc_Print(iVar26,"%9.2f sec\n",(double)(lVar27 + lVar28) / 1000000.0);
        vSops_00 = Acb_TransformPatchFunctions(vSops,vSupps,&vUsed,vDivs->nSize);
        uVar3 = vSops_00->nSize;
        lVar28 = (long)(int)uVar3;
        if (1 < lVar28) {
          uVar22 = 0;
          do {
            lVar28 = lVar28 + -1;
            ppvVar14 = vSops_00->pArray;
            pvVar5 = ppvVar14[uVar22];
            ppvVar14[uVar22] = ppvVar14[lVar28];
            vSops_00->pArray[lVar28] = pvVar5;
            uVar22 = uVar22 + 1;
          } while (uVar3 >> 1 != uVar22);
        }
      }
      else {
        uVar3 = vDivs->nSize;
        pVVar16 = (Vec_Int_t *)malloc(0x10);
        uVar23 = 0x10;
        if (0xe < uVar3 - 1) {
          uVar23 = uVar3;
        }
        pVVar16->nSize = 0;
        pVVar16->nCap = uVar23;
        if (uVar23 == 0) {
          piVar10 = (int *)0x0;
        }
        else {
          piVar10 = (int *)malloc((long)(int)uVar23 << 2);
        }
        pVVar16->pArray = piVar10;
        pVVar16->nSize = uVar3;
        if (0 < (int)uVar3) {
          uVar22 = 0;
          do {
            piVar10[uVar22] = (int)uVar22;
            uVar22 = uVar22 + 1;
          } while (uVar3 != uVar22);
        }
        uVar3 = vGias->nSize;
        lVar28 = (long)(int)uVar3;
        vUsed = pVVar16;
        if (lVar28 < 2) {
          vSops_00 = (Vec_Ptr_t *)0x0;
        }
        else {
          vSops_00 = (Vec_Ptr_t *)0x0;
          uVar22 = 0;
          do {
            lVar28 = lVar28 + -1;
            ppvVar14 = vGias->pArray;
            pvVar5 = ppvVar14[uVar22];
            ppvVar14[uVar22] = ppvVar14[lVar28];
            vGias->pArray[lVar28] = pvVar5;
            uVar22 = uVar22 + 1;
          } while (uVar3 >> 1 != uVar22);
        }
      }
      pVVar12 = local_90;
      pVVar16 = vUsed;
      local_b8 = Acb_GenerateInstance(pNtkF,vDivs,vUsed,local_90);
      p = Acb_GeneratePatch(pNtkF,vDivs,pVVar16,vSops_00,vGias,pVVar12);
      Acb_PrintPatch(pNtkF,vDivs,pVVar16,local_b0);
      ppcVar6 = local_60;
      if (local_60[3] == (char *)0x0) {
        Acb_GenerateFilePatch(p,"patch.v");
      }
      pcVar25 = ppcVar6[3];
      if (pcVar25 == (char *)0x0) {
        pcVar25 = "out.v";
      }
      Acb_GenerateFileOut(local_b8,*ppcVar6,pcVar25,p);
      pcVar25 = ppcVar6[3];
      if (pcVar25 == (char *)0x0) {
        pcVar25 = "out.v";
      }
      printf("Finished dumping resulting file \"%s\".\n\n",pcVar25);
      goto LAB_0039eebc;
    }
    uVar23 = (int)uVar21 - 1;
    printf("\nConsidering target %d (out of %d)...\n",(ulong)uVar23,uVar22);
    if (fCisOnly == 0) {
      pCVar15 = Acb_NtkDeriveMiterCnf(local_100,uVar23,uVar3,fVerbose);
      uVar21 = (ulong)(uint)vDivs->nSize;
      pVVar16 = Acb_DerivePatchSupport
                          (pCVar15,uVar23,uVar3,vDivs->nSize,vDivs,pNtkF,pVVar8,(int)local_38);
      if (pVVar16 == (Vec_Int_t *)0x0) {
        Cnf_DataFree(pCVar15);
        bVar29 = false;
        local_e4 = 0;
      }
      else {
        if (0 < pVVar16->nSize) {
          lVar28 = 0;
          do {
            Vec_IntPush(pVVar8,pVVar16->pArray[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 < pVVar16->nSize);
        }
        iVar7 = (int)uVar21;
        pVVar16->nSize = 0;
        if (0 < pVVar8->nSize) {
          lVar28 = 0;
          do {
            Vec_IntPush(pVVar16,pVVar8->pArray[lVar28]);
            iVar7 = (int)uVar21;
            lVar28 = lVar28 + 1;
          } while (lVar28 < pVVar8->nSize);
        }
        bVar29 = false;
        pcVar25 = Acb_DeriveOnePatchFunction(pCVar15,uVar23,uVar3,iVar7,pVVar16,0);
        Cnf_DataFree(pCVar15);
        if (pcVar25 != (char *)0x0) {
          pGVar13 = Abc_SopSynthesizeOne(pcVar25,1);
          printf("Tar%02d: ");
          Gia_ManPrintStats(pGVar13,(Gps_Par_t *)0x0);
          local_68 = Acb_UpdateMiter(local_100,pGVar13,uVar23,uVar3,pVVar16,0);
          Gia_ManStop(local_100);
          Gia_ManStop(pGVar13);
          uVar4 = vSops->nSize;
          uVar19 = vSops->nCap;
          if (uVar4 == uVar19) {
            if ((int)uVar19 < 0x10) {
              if (vSops->pArray == (void **)0x0) {
                ppvVar14 = (void **)malloc(0x80);
              }
              else {
                ppvVar14 = (void **)realloc(vSops->pArray,0x80);
              }
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar19 * 2;
              if (iVar7 <= (int)uVar19) goto LAB_0039eb88;
              if (vSops->pArray == (void **)0x0) {
                ppvVar14 = (void **)malloc((ulong)uVar19 << 4);
              }
              else {
                ppvVar14 = (void **)realloc(vSops->pArray,(ulong)uVar19 << 4);
              }
            }
            vSops->pArray = ppvVar14;
            vSops->nCap = iVar7;
          }
LAB_0039eb88:
          vSops->nSize = uVar4 + 1;
          vSops->pArray[(int)uVar4] = pcVar25;
          if (fVeryVerbose != 0) {
            printf("Function %d\n%s",(ulong)uVar23,pcVar25);
          }
          local_100 = local_68;
          goto LAB_0039ea37;
        }
        local_e4 = 0;
      }
    }
    else {
      uVar4 = vDivs->nSize;
      pVVar16 = (Vec_Int_t *)malloc(0x10);
      uVar19 = uVar4;
      if (uVar4 - 1 < 0xf) {
        uVar19 = 0x10;
      }
      pVVar16->nSize = 0;
      pVVar16->nCap = uVar19;
      if (uVar19 == 0) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = (int *)malloc((long)(int)uVar19 << 2);
      }
      pVVar16->pArray = piVar10;
      pVVar16->nSize = uVar4;
      if (0 < (int)uVar4) {
        uVar21 = 0;
        do {
          piVar10[uVar21] = (int)uVar21;
          uVar21 = uVar21 + 1;
        } while (uVar4 != uVar21);
      }
      printf("Target %d has support with %d variables.\n",(ulong)uVar23,(ulong)uVar4);
      pGVar13 = Acb_NtkDeriveMiterCnfInter(local_100,uVar23,uVar3);
      printf("Tar%02d: ");
      Gia_ManPrintStats(pGVar13,(Gps_Par_t *)0x0);
      pGVar17 = Acb_UpdateMiter(local_100,pGVar13,uVar23,uVar3,pVVar16,fCisOnly);
      Gia_ManStop(local_100);
      uVar4 = vGias->nCap;
      if (vGias->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (vGias->pArray == (void **)0x0) {
            ppvVar14 = (void **)malloc(0x80);
          }
          else {
            ppvVar14 = (void **)realloc(vGias->pArray,0x80);
          }
          vGias->pArray = ppvVar14;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar4 * 2;
          if (iVar7 <= (int)uVar4) goto LAB_0039ea20;
          if (vGias->pArray == (void **)0x0) {
            ppvVar14 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar14 = (void **)realloc(vGias->pArray,(ulong)uVar4 << 4);
          }
          vGias->pArray = ppvVar14;
        }
        vGias->nCap = iVar7;
      }
LAB_0039ea20:
      iVar7 = vGias->nSize;
      vGias->nSize = iVar7 + 1;
      vGias->pArray[iVar7] = pGVar13;
      local_100 = pGVar17;
LAB_0039ea37:
      uVar4 = vSupps->nCap;
      uVar19 = vSupps->nSize;
      if (uVar19 == uVar4) {
        lVar28 = (long)(int)uVar4;
        if ((int)uVar4 < 0x10) {
          if (vSupps->pArray == (Vec_Int_t *)0x0) {
            pVVar8 = (Vec_Int_t *)malloc(0x100);
          }
          else {
            pVVar8 = (Vec_Int_t *)realloc(vSupps->pArray,0x100);
          }
          vSupps->pArray = pVVar8;
          memset(pVVar8 + lVar28,0,(0x10 - lVar28) * 0x10);
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar4 * 2;
          if (iVar7 <= (int)uVar4) goto LAB_0039eaeb;
          if (vSupps->pArray == (Vec_Int_t *)0x0) {
            pVVar8 = (Vec_Int_t *)malloc((ulong)uVar4 << 5);
          }
          else {
            pVVar8 = (Vec_Int_t *)realloc(vSupps->pArray,(ulong)uVar4 << 5);
          }
          vSupps->pArray = pVVar8;
          memset(pVVar8 + lVar28,0,lVar28 * 0x10);
        }
        vSupps->nCap = iVar7;
        pVVar8 = local_40;
      }
LAB_0039eaeb:
      vSupps->nSize = uVar19 + 1;
      if ((int)uVar19 < 0) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
      }
      if (0 < pVVar16->nSize) {
        pVVar12 = vSupps->pArray;
        lVar28 = 0;
        do {
          Vec_IntPush(pVVar12 + ((ulong)(uVar19 + 1) - 1),pVVar16->pArray[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 < pVVar16->nSize);
      }
      if (pVVar16->pArray != (int *)0x0) {
        free(pVVar16->pArray);
        pVVar16->pArray = (int *)0x0;
      }
      free(pVVar16);
      bVar29 = true;
    }
    uVar21 = (ulong)uVar23;
    pVVar16 = local_40;
  } while (bVar29);
LAB_0039ebd5:
  local_b8 = (Vec_Str_t *)0x0;
  p = (Vec_Str_t *)0x0;
  vSops_00 = (Vec_Ptr_t *)0x0;
LAB_0039eebc:
  if (vGias != (Vec_Ptr_t *)0x0) {
    if (0 < vGias->nSize) {
      lVar28 = 0;
      do {
        Gia_ManStop((Gia_Man_t *)vGias->pArray[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 < vGias->nSize);
    }
    if (vGias->pArray != (void **)0x0) {
      free(vGias->pArray);
      vGias->pArray = (void **)0x0;
    }
    free(vGias);
  }
  if (p != (Vec_Str_t *)0x0) {
    if (p->pArray != (char *)0x0) {
      free(p->pArray);
      p->pArray = (char *)0x0;
    }
    free(p);
  }
  if (local_b8 != (Vec_Str_t *)0x0) {
    if (local_b8->pArray != (char *)0x0) {
      free(local_b8->pArray);
      local_b8->pArray = (char *)0x0;
    }
    free(local_b8);
  }
  iVar7 = vSops->nSize;
  if (0 < (long)iVar7) {
    ppvVar14 = vSops->pArray;
    lVar28 = 0;
    do {
      if ((void *)0x2 < ppvVar14[lVar28]) {
        free(ppvVar14[lVar28]);
      }
      lVar28 = lVar28 + 1;
    } while (iVar7 != lVar28);
  }
  if (vSops->pArray != (void **)0x0) {
    free(vSops->pArray);
    vSops->pArray = (void **)0x0;
  }
  free(vSops);
  iVar7 = vSupps->nCap;
  if (0 < (long)iVar7) {
    pVVar16 = vSupps->pArray;
    lVar28 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar16->pArray + lVar28);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        *(undefined8 *)((long)&pVVar16->pArray + lVar28) = 0;
      }
      lVar28 = lVar28 + 0x10;
    } while ((long)iVar7 * 0x10 != lVar28);
  }
  if (vSupps->pArray != (Vec_Int_t *)0x0) {
    free(vSupps->pArray);
    vSupps->pArray = (Vec_Int_t *)0x0;
  }
  vSupps->nCap = 0;
  vSupps->nSize = 0;
  free(vSupps);
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  pVVar16 = local_70;
  pVVar8 = vUsed;
  if (vUsed != (Vec_Int_t *)0x0) {
    if (vUsed->pArray != (int *)0x0) {
      free(vUsed->pArray);
      pVVar8->pArray = (int *)0x0;
    }
    free(pVVar8);
    vUsed = (Vec_Int_t *)0x0;
  }
  if (vSops_00 != (Vec_Ptr_t *)0x0) {
    if (0 < vSops_00->nSize) {
      lVar28 = 0;
      do {
        if ((void *)0x2 < vSops_00->pArray[lVar28]) {
          free(vSops_00->pArray[lVar28]);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < vSops_00->nSize);
    }
    if (vSops_00->pArray != (void **)0x0) {
      free(vSops_00->pArray);
      vSops_00->pArray = (void **)0x0;
    }
    free(vSops_00);
  }
  Gia_ManStop(local_80);
  Gia_ManStop(local_88);
  Gia_ManStop(local_100);
  pVVar12 = local_58;
  pVVar8 = local_78;
  if (pVVar9 != (Vec_Int_t *)0x0) {
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (int *)0x0;
    }
    free(pVVar9);
  }
  if (pVVar16 != (Vec_Int_t *)0x0) {
    if (pVVar16->pArray != (int *)0x0) {
      free(pVVar16->pArray);
      pVVar16->pArray = (int *)0x0;
    }
    free(pVVar16);
  }
  pVVar9 = local_48;
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  pVVar9 = local_50;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      pVVar12->pArray = (int *)0x0;
    }
    free(pVVar12);
  }
  if (pVVar9 != (Vec_Int_t *)0x0) {
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (int *)0x0;
    }
    free(pVVar9);
  }
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (int *)0x0;
    }
    free(pVVar8);
  }
  if (vDivs != (Vec_Int_t *)0x0) {
    if (vDivs->pArray != (int *)0x0) {
      free(vDivs->pArray);
      vDivs->pArray = (int *)0x0;
    }
    free(vDivs);
  }
  if (vBlock != (Vec_Bit_t *)0x0) {
    if (vBlock->pArray != (int *)0x0) {
      free(vBlock->pArray);
      vBlock->pArray = (int *)0x0;
    }
    free(vBlock);
  }
  return local_e4;
}

Assistant:

int Acb_NtkEcoPerform( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG, char * pFileName[4], int fCisOnly, int fInputs, int fCheck, int fVerbose, int fVeryVerbose )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );

    abctime clk  = Abc_Clock();
    int nTargets = Vec_IntSize(&pNtkF->vTargets);
    int TimeOut  = fCisOnly ? 0 : 120;  // 60 seconds
    int RetValue = 1;

    // compute various sets of nodes
    Vec_Bit_t * vBlock;
    Vec_Int_t * vRoots  = Acb_NtkFindRoots( pNtkF, &pNtkF->vTargets, &vBlock );
    Vec_Int_t * vSuppF  = Acb_NtkFindSupp( pNtkF, vRoots );
    Vec_Int_t * vSuppG  = Acb_NtkFindSupp( pNtkG, vRoots );
    Vec_Int_t * vSupp   = Vec_IntTwoMerge( vSuppF, vSuppG );
    Vec_Int_t * vDivs   = (fCisOnly || fInputs) ? Acb_NtkFindDivsCis( pNtkF, vSupp ) : Acb_NtkFindDivs( pNtkF, vSupp, vBlock, fVerbose );
    Vec_Int_t * vNodesF = Acb_NtkFindNodes( pNtkF, vRoots, vDivs );
    Vec_Int_t * vNodesG = Acb_NtkFindNodes( pNtkG, vRoots, NULL );

    // create AIGs
    Gia_Man_t * pGiaF   = Acb_NtkToGia( pNtkF, vSupp, vNodesF, vRoots, vDivs, &pNtkF->vTargets );
    Gia_Man_t * pGiaG   = Acb_NtkToGia( pNtkG, vSupp, vNodesG, vRoots, NULL, NULL );
    Gia_Man_t * pGiaM   = Acb_CreateMiter( pGiaF, pGiaG );

    Cnf_Dat_t * pCnf;
    Gia_Man_t * pTemp, * pOne;
    Vec_Ptr_t * vSops    = Vec_PtrAlloc( nTargets );
    Vec_Wec_t * vSupps   = Vec_WecAlloc( nTargets );
    Vec_Int_t * vSuppOld = Vec_IntAlloc( 100 );

    Vec_Int_t * vUsed  = NULL; 
    Vec_Ptr_t * vFuncs = NULL;
    Vec_Ptr_t * vGias  = fCisOnly ? Vec_PtrAlloc(nTargets) : NULL;
    Vec_Str_t * vInst  = NULL, * vPatch = NULL;

    char * pSop = NULL;
    int i;

    if ( fVerbose )
    {
        printf( "The number of targets = %d.\n", nTargets );

        printf( "NtkF:  " );
        Gia_ManPrintStats( pGiaF, NULL );
        printf( "NtkG:  " );
        Gia_ManPrintStats( pGiaG, NULL );
        printf( "Miter: " );
        Gia_ManPrintStats( pGiaM, NULL );
    }

    // check that the problem has a solution
    if ( fCheck )//fCisOnly )
    {
        int Lit, status;
        sat_solver * pSat;
        pCnf = Acb_NtkDeriveMiterCnf( pGiaM, nTargets, nTargets, fVerbose );
        pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        Cnf_DataFree( pCnf );
        // add output clause
        Lit = Abc_Var2Lit( 1, 0 );
        status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        status = status == 0 ? l_False : sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        sat_solver_delete( pSat );
        printf( "The ECO problem has %s solution. ", status == l_False ? "a" : "NO" );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( status != l_False )
        {
            RetValue = 0;
            goto cleanup;
        }
    }

    for ( i = nTargets-1; i >= 0; i-- )
    {
        Vec_Int_t * vSupp = NULL;
        printf( "\nConsidering target %d (out of %d)...\n", i, nTargets );
        // compute support of this target
        if ( fCisOnly )
        {
            vSupp = Vec_IntStartNatural( Vec_IntSize(vDivs) );
            printf( "Target %d has support with %d variables.\n", i, Vec_IntSize(vSupp) );

            pOne = Acb_NtkDeriveMiterCnfInter( pGiaM, i, nTargets );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );

            // add to functions
            Vec_PtrPush( vGias, pOne );
        }
        else
        {
            pCnf = Acb_NtkDeriveMiterCnf( pGiaM, i, nTargets, fVerbose );
//            vSupp = Acb_DerivePatchSupportS( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, NULL, TimeOut );
            vSupp = Acb_DerivePatchSupport( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, vSuppOld, TimeOut );
            if ( vSupp == NULL )
            {
                Cnf_DataFree( pCnf );
                RetValue = 0;
                goto cleanup;
            }
            Vec_IntAppend( vSuppOld, vSupp );
            Vec_IntClear( vSupp );
            Vec_IntAppend( vSupp, vSuppOld );
            //Vec_IntClear( vSuppOld );

            // derive function of this target
            pSop  = Acb_DeriveOnePatchFunction( pCnf, i, nTargets, Vec_IntSize(vDivs), vSupp, fCisOnly );
            Cnf_DataFree( pCnf );
            if ( pSop == NULL )
            {
                RetValue = 0;
                goto cleanup;
            }

            // add new function to the miter
            pOne  = Abc_SopSynthesizeOne( pSop, 1 );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );
            Gia_ManStop( pOne );

            // add to functions
            Vec_PtrPush( vSops, pSop );
            if ( fVeryVerbose )
                printf( "Function %d\n%s", i, pSop );
        }
        // add to supports
        Vec_IntAppend( Vec_WecPushLevel(vSupps), vSupp );
        Vec_IntFree( vSupp );
    }

    // make sure the function is UNSAT
    printf( "\n" );
    if ( !fCisOnly )
    {
        int Res;
        abctime clk  = Abc_Clock();
        pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGiaM, 8, 0, 0, 0, 0 );
        Res = Acb_CheckMiter( pCnf );
        Cnf_DataFree( pCnf );
        if ( Res == 1 )
            printf( "The ECO solution was verified successfully.  " );
        else
            printf( "The ECO solution verification FAILED.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }

    // derive new patch functions
    if ( fCisOnly )
    {
        vUsed = Vec_IntStartNatural( Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vGias );
    }
    else
    {
        vFuncs = Acb_TransformPatchFunctions( vSops, vSupps, &vUsed, Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vFuncs );
    }

    // generate instance and patch
    vInst   = Acb_GenerateInstance( pNtkF, vDivs, vUsed, &pNtkF->vTargets );
    vPatch  = Acb_GeneratePatch( pNtkF, vDivs, vUsed, vFuncs, vGias, &pNtkF->vTargets );

    // print the results
    //printf( "%s", Vec_StrArray(vPatch) );
    Acb_PrintPatch( pNtkF, vDivs, vUsed, clk );

    // generate output files
    if ( pFileName[3] == NULL ) Acb_GenerateFilePatch( vPatch, "patch.v" );
    Acb_GenerateFileOut( vInst, pFileName[0], pFileName[3] ? pFileName[3] : (char *)"out.v", vPatch );
    printf( "Finished dumping resulting file \"%s\".\n\n", pFileName[3] ? pFileName[3] : "out.v" );
    //Gia_AigerWrite( pGiaG, "test.aig", 0, 0, 0 );
cleanup:
    // cleanup
    if ( vGias )
    {
        Gia_Man_t * pTemp; int i;
        Vec_PtrForEachEntry( Gia_Man_t *, vGias, pTemp, i )
            Gia_ManStop( pTemp );
        Vec_PtrFree( vGias );
    }
    Vec_StrFreeP( &vPatch );
    Vec_StrFreeP( &vInst );

    Vec_PtrFreeFree( vSops );
    Vec_WecFree( vSupps );
    Vec_IntFree( vSuppOld );
    Vec_IntFreeP( &vUsed );
    if ( vFuncs ) Vec_PtrFreeFree( vFuncs );

    Gia_ManStop( pGiaF );
    Gia_ManStop( pGiaG );
    Gia_ManStop( pGiaM );

    Vec_IntFreeP( &vSuppF );
    Vec_IntFreeP( &vSuppG );
    Vec_IntFreeP( &vSupp );
    Vec_IntFreeP( &vNodesF );
    Vec_IntFreeP( &vNodesG );
    Vec_IntFreeP( &vRoots );
    Vec_IntFreeP( &vDivs );
    Vec_BitFreeP( &vBlock );
    return RetValue;
}